

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.h
# Opt level: O0

LinkedToken * __thiscall Linker::searchForLink(Linker *this,Token *token)

{
  bool bVar1;
  const_iterator this_00;
  pointer ppVar2;
  ulong uVar3;
  LinkedToken *this_01;
  Token *in_RDI;
  LinkedToken linkedToken;
  const_iterator namespaceLink;
  string link;
  Token *in_stack_00000480;
  EngineSearch *in_stack_00000488;
  Token *in_stack_fffffffffffffe48;
  LinkedToken *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  string local_150 [40];
  LinkedToken *in_stack_fffffffffffffed8;
  Cache<LinkedToken> *in_stack_fffffffffffffee0;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  _Self local_58;
  Token *in_stack_ffffffffffffffb0;
  HeaderSearch *in_stack_ffffffffffffffb8;
  _Self local_40;
  string local_38 [48];
  LinkedToken *local_8;
  
  std::__cxx11::string::string(local_38);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffe48,(key_type *)0x1bcfba);
  local_40._M_node = this_00._M_node;
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe48);
  bVar1 = std::operator!=(&local_40,&local_58);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x1bd00f);
    std::__cxx11::string::operator=(local_38,(string *)&ppVar2->second);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    SymbolIndexSearch::operator()[abi_cxx11_((SymbolIndexSearch *)this,token);
    std::__cxx11::string::operator=(local_38,local_78);
    std::__cxx11::string::~string(local_78);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    EngineSearch::operator()[abi_cxx11_(in_stack_00000488,in_stack_00000480);
    std::__cxx11::string::operator=(local_38,local_98);
    std::__cxx11::string::~string(local_98);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    HeaderSearch::operator()[abi_cxx11_(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__cxx11::string::operator=(local_38,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    Token::Token(&in_stack_fffffffffffffe50->token,in_stack_fffffffffffffe48);
    std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    LinkedToken::LinkedToken
              ((LinkedToken *)this_00._M_node,in_RDI,(string *)in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_150);
    Token::~Token((Token *)0x1bd1d3);
    LinkedToken::LinkedToken(in_stack_fffffffffffffe50,(LinkedToken *)&stack0xfffffffffffffe68);
    this_01 = Cache<LinkedToken>::add(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_8 = this_01;
    LinkedToken::~LinkedToken(this_01);
    LinkedToken::~LinkedToken(this_01);
  }
  else {
    local_8 = (LinkedToken *)0x0;
  }
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

LinkedToken* searchForLink(const Token& token) {
			std::string link;

			const auto namespaceLink = namespaceLinks.find(token.content);
			if (namespaceLink != namespaceLinks.end()) {
				link = namespaceLink->second;
			}

			if (link.empty()) {
				link = symbolSearch(token);
			}

			if (link.empty()) {
				link = engineSearch(token);
			}

			if (link.empty()) {
				link = headerSearch(token);
			}

			if (link.empty()) {
				return nullptr;
			}

			LinkedToken linkedToken(token, "https://en.cppreference.com" + link);
			return tokenCache.add(std::move(linkedToken));
		}